

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O1

void __thiscall
duckdb::LocalSortState::ReOrder
          (LocalSortState *this,SortedData *sd,data_ptr_t sorting_ptr,RowDataCollection *heap,
          GlobalSortState *gstate,bool reorder_heap)

{
  RowLayout *layout;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *this_00;
  idx_t count;
  BufferManager *pBVar1;
  size_t size;
  pointer puVar2;
  pointer pBVar3;
  pointer pBVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> _Var6;
  __uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> _Var7;
  RowLayout *this_01;
  LocalSortState *pLVar8;
  RowDataCollection *pRVar9;
  int iVar10;
  reference pvVar11;
  pointer pRVar12;
  pointer pRVar13;
  tuple<duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_> this_02;
  BlockHandle *pBVar14;
  undefined4 extraout_var;
  char *pcVar15;
  data_ptr_t pdVar16;
  pointer this_03;
  ulong capacity;
  undefined3 in_register_00000089;
  idx_t iVar17;
  idx_t iVar18;
  ulong uVar19;
  pointer this_04;
  data_ptr_t pdVar20;
  templated_unique_single_t ordered_heap_block;
  templated_unique_single_t ordered_data_block;
  BufferHandle ordered_data_handle;
  BufferHandle ordered_heap_handle;
  BufferHandle unordered_data_handle;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> local_b8;
  __uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> local_b0;
  SortedData *local_a8;
  RowLayout *local_a0;
  LocalSortState *local_98;
  undefined4 local_8c;
  BufferHandle local_88;
  RowDataCollection *local_70;
  GlobalSortState *local_68;
  BufferHandle local_60;
  BufferHandle local_48;
  
  local_8c = CONCAT31(in_register_00000089,reorder_heap);
  sd->swizzled = reorder_heap;
  local_a0 = (RowLayout *)&sd->data_blocks;
  local_a8 = sd;
  local_70 = heap;
  local_68 = gstate;
  pvVar11 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
            ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    *)local_a0);
  pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator->(pvVar11);
  count = pRVar12->count;
  pBVar1 = this->buffer_manager;
  pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator->(pvVar11);
  (*pBVar1->_vptr_BufferManager[7])(&local_48,pBVar1,pRVar12);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.node);
  pdVar20 = (local_48.node.ptr)->buffer;
  pBVar1 = this->buffer_manager;
  local_98 = this;
  pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator->(pvVar11);
  pRVar13 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator->(pvVar11);
  this_02.super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
  .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>)
       operator_new(0x30);
  RowDataBlock::RowDataBlock
            ((RowDataBlock *)
             this_02.
             super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
             .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl,ORDER_BY,pBVar1,
             pRVar12->capacity,pRVar13->entry_size);
  local_b0._M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
  super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl =
       (tuple<duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>)
       (tuple<duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>)
       this_02.
       super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
       super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
  pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                        *)&local_b0);
  pRVar12->count = count;
  pBVar1 = local_98->buffer_manager;
  pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                        *)&local_b0);
  (*pBVar1->_vptr_BufferManager[7])(&local_88,pBVar1,pRVar12);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_88.node);
  size = (local_a8->layout).row_width;
  if (count != 0) {
    iVar18 = (local_68->sort_layout).entry_size;
    pdVar16 = (local_88.node.ptr)->buffer;
    iVar17 = count;
    do {
      FastMemcpy(pdVar16,pdVar20 + *(uint *)sorting_ptr * size,size);
      pdVar16 = pdVar16 + size;
      sorting_ptr = (data_ptr_t)((long)sorting_ptr + iVar18);
      iVar17 = iVar17 - 1;
    } while (iVar17 != 0);
  }
  pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
            operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                        *)&local_b0);
  pLVar8 = local_98;
  this_01 = local_a0;
  pBVar14 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pRVar12->block);
  pcVar15 = "LocalSortState::ReOrder.ordered_data";
  if ((local_a8->swizzled & 1U) == 0) {
    pcVar15 = (char *)0x0;
  }
  if ((local_a8->layout).all_constant != false) {
    pcVar15 = (char *)0x0;
  }
  pBVar14->unswizzled = pcVar15;
  ::std::
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
  ::_M_erase_at_end((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     *)this_01,
                    (local_a8->data_blocks).
                    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  ::std::
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
            ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
              *)this_01,
             (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *)
             &local_b0);
  if (((char)local_8c != '\0') && ((local_a8->layout).all_constant == false)) {
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_88.node);
    layout = &local_a8->layout;
    RowOperations::SwizzleColumns(layout,(local_88.node.ptr)->buffer,count);
    pvVar11 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              ::back((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                      *)this_01);
    pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
              operator->(pvVar11);
    pBVar14 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pRVar12->block);
    pBVar14->unswizzled = (char *)0x0;
    puVar2 = (local_70->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar19 = 0;
    for (this_03 = (local_70->blocks).
                   super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_03 != puVar2;
        this_03 = this_03 + 1) {
      pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator->(this_03);
      uVar19 = uVar19 + pRVar12->byte_offset;
    }
    iVar10 = (*pLVar8->buffer_manager->_vptr_BufferManager[0xf])();
    pBVar1 = pLVar8->buffer_manager;
    local_b8._M_head_impl = (RowDataBlock *)operator_new(0x30);
    capacity = CONCAT44(extraout_var,iVar10);
    if (CONCAT44(extraout_var,iVar10) < uVar19) {
      capacity = uVar19;
    }
    RowDataBlock::RowDataBlock(local_b8._M_head_impl,ORDER_BY,pBVar1,capacity,1);
    pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
              operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                          *)&local_b8);
    pLVar8 = local_98;
    pRVar12->count = count;
    pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
              operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                          *)&local_b8);
    pRVar12->byte_offset = uVar19;
    pBVar1 = pLVar8->buffer_manager;
    local_a0 = layout;
    pRVar12 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
              operator->((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                          *)&local_b8);
    (*pBVar1->_vptr_BufferManager[7])(&local_60,pBVar1,pRVar12);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_60.node);
    pdVar20 = (local_60.node.ptr)->buffer;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_88.node);
    if (count != 0) {
      pdVar16 = (local_88.node.ptr)->buffer + (local_a8->layout).heap_pointer_offset;
      iVar18 = count;
      do {
        uVar19 = (ulong)**(uint **)pdVar16;
        switchD_00b1422a::default(pdVar20,*(uint **)pdVar16,uVar19);
        pdVar20 = pdVar20 + uVar19;
        pdVar16 = pdVar16 + size;
        iVar18 = iVar18 - 1;
      } while (iVar18 != 0);
    }
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_88.node);
    pdVar20 = (local_88.node.ptr)->buffer;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_60.node);
    RowOperations::SwizzleHeapPointer(local_a0,pdVar20,(local_60.node.ptr)->buffer,count,0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
              ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                *)&local_a8->heap_blocks,
               (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *)
               &local_b8);
    pRVar9 = local_70;
    this_00 = &local_70->blocks;
    pBVar3 = (local_70->pinned_blocks).
             super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
             super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    pBVar4 = (local_70->pinned_blocks).
             super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
             super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
             .super__Vector_impl_data._M_finish;
    this_04 = pBVar3;
    if (pBVar4 != pBVar3) {
      do {
        BufferHandle::~BufferHandle(this_04);
        this_04 = this_04 + 1;
      } while (this_04 != pBVar4);
      (pRVar9->pinned_blocks).
      super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
      super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = pBVar3;
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::_M_erase_at_end(&this_00->
                       super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                      ,(pRVar9->blocks).
                       super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    pRVar9->count = 0;
    BufferHandle::~BufferHandle(&local_60);
    _Var6._M_head_impl = local_b8._M_head_impl;
    if (local_b8._M_head_impl != (RowDataBlock *)0x0) {
      p_Var5 = ((local_b8._M_head_impl)->block).internal.
               super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      operator_delete(_Var6._M_head_impl);
    }
  }
  BufferHandle::~BufferHandle(&local_88);
  _Var7._M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
  super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl =
       local_b0._M_t.
       super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
       super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
  if ((_Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>)
      local_b0._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
      super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl != (RowDataBlock *)0x0) {
    p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_b0._M_t.
                    super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
                    .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl + 8))->_M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    operator_delete((void *)_Var7._M_t.
                            super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
                            .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl);
  }
  BufferHandle::~BufferHandle(&local_48);
  return;
}

Assistant:

void LocalSortState::ReOrder(SortedData &sd, data_ptr_t sorting_ptr, RowDataCollection &heap, GlobalSortState &gstate,
                             bool reorder_heap) {
	sd.swizzled = reorder_heap;
	auto &unordered_data_block = sd.data_blocks.back();
	const idx_t count = unordered_data_block->count;
	auto unordered_data_handle = buffer_manager->Pin(unordered_data_block->block);
	const data_ptr_t unordered_data_ptr = unordered_data_handle.Ptr();
	// Create new block that will hold re-ordered row data
	auto ordered_data_block = make_uniq<RowDataBlock>(MemoryTag::ORDER_BY, *buffer_manager,
	                                                  unordered_data_block->capacity, unordered_data_block->entry_size);
	ordered_data_block->count = count;
	auto ordered_data_handle = buffer_manager->Pin(ordered_data_block->block);
	data_ptr_t ordered_data_ptr = ordered_data_handle.Ptr();
	// Re-order fixed-size row layout
	const idx_t row_width = sd.layout.GetRowWidth();
	const idx_t sorting_entry_size = gstate.sort_layout.entry_size;
	for (idx_t i = 0; i < count; i++) {
		auto index = Load<uint32_t>(sorting_ptr);
		FastMemcpy(ordered_data_ptr, unordered_data_ptr + index * row_width, row_width);
		ordered_data_ptr += row_width;
		sorting_ptr += sorting_entry_size;
	}
	ordered_data_block->block->SetSwizzling(
	    sd.layout.AllConstant() || !sd.swizzled ? nullptr : "LocalSortState::ReOrder.ordered_data");
	// Replace the unordered data block with the re-ordered data block
	sd.data_blocks.clear();
	sd.data_blocks.push_back(std::move(ordered_data_block));
	// Deal with the heap (if necessary)
	if (!sd.layout.AllConstant() && reorder_heap) {
		// Swizzle the column pointers to offsets
		RowOperations::SwizzleColumns(sd.layout, ordered_data_handle.Ptr(), count);
		sd.data_blocks.back()->block->SetSwizzling(nullptr);
		// Create a single heap block to store the ordered heap
		idx_t total_byte_offset =
		    std::accumulate(heap.blocks.begin(), heap.blocks.end(), (idx_t)0,
		                    [](idx_t a, const unique_ptr<RowDataBlock> &b) { return a + b->byte_offset; });
		idx_t heap_block_size = MaxValue(total_byte_offset, buffer_manager->GetBlockSize());
		auto ordered_heap_block = make_uniq<RowDataBlock>(MemoryTag::ORDER_BY, *buffer_manager, heap_block_size, 1U);
		ordered_heap_block->count = count;
		ordered_heap_block->byte_offset = total_byte_offset;
		auto ordered_heap_handle = buffer_manager->Pin(ordered_heap_block->block);
		data_ptr_t ordered_heap_ptr = ordered_heap_handle.Ptr();
		// Fill the heap in order
		ordered_data_ptr = ordered_data_handle.Ptr();
		const idx_t heap_pointer_offset = sd.layout.GetHeapOffset();
		for (idx_t i = 0; i < count; i++) {
			auto heap_row_ptr = Load<data_ptr_t>(ordered_data_ptr + heap_pointer_offset);
			auto heap_row_size = Load<uint32_t>(heap_row_ptr);
			memcpy(ordered_heap_ptr, heap_row_ptr, heap_row_size);
			ordered_heap_ptr += heap_row_size;
			ordered_data_ptr += row_width;
		}
		// Swizzle the base pointer to the offset of each row in the heap
		RowOperations::SwizzleHeapPointer(sd.layout, ordered_data_handle.Ptr(), ordered_heap_handle.Ptr(), count);
		// Move the re-ordered heap to the SortedData, and clear the local heap
		sd.heap_blocks.push_back(std::move(ordered_heap_block));
		heap.pinned_blocks.clear();
		heap.blocks.clear();
		heap.count = 0;
	}
}